

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O1

lzma_ret lzma_stream_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,uint64_t memlimit,uint32_t flags
                   )

{
  byte bVar1;
  undefined4 *puVar2;
  lzma_index_hash *plVar3;
  
  if ((code *)next->init != lzma_stream_decoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_decoder_init;
  if (0x1f < flags) {
    return LZMA_OPTIONS_ERROR;
  }
  puVar2 = (undefined4 *)next->coder;
  if (puVar2 == (undefined4 *)0x0) {
    puVar2 = (undefined4 *)lzma_alloc(0x580,allocator);
    if (puVar2 == (undefined4 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = puVar2;
    next->code = stream_decode;
    next->end = stream_decoder_end;
    next->get_check = stream_decoder_get_check;
    next->memconfig = stream_decoder_memconfig;
    *(undefined8 *)(puVar2 + 2) = 0;
    *(undefined8 *)(puVar2 + 4) = 0xffffffffffffffff;
    *(undefined8 *)(puVar2 + 6) = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 10) = 0;
    *(undefined8 *)(puVar2 + 0xc) = 0;
    *(undefined8 *)(puVar2 + 0xe) = 0;
    *(undefined8 *)(puVar2 + 0x10) = 0;
    *(undefined8 *)(puVar2 + 0x12) = 0;
    *(undefined8 *)(puVar2 + 0x56) = 0;
  }
  *(uint64_t *)(puVar2 + 0x58) = memlimit + (memlimit == 0);
  *(undefined8 *)(puVar2 + 0x5a) = 0x8000;
  bVar1 = (byte)flags;
  *(byte *)(puVar2 + 0x5c) = bVar1 & 1;
  *(byte *)((long)puVar2 + 0x171) = bVar1 >> 1 & 1;
  *(byte *)((long)puVar2 + 0x172) = bVar1 >> 2 & 1;
  *(bool *)((long)puVar2 + 0x173) = 0xf < flags;
  *(byte *)(puVar2 + 0x5d) = bVar1 >> 3 & 1;
  *(undefined1 *)((long)puVar2 + 0x175) = 1;
  plVar3 = lzma_index_hash_init(*(lzma_index_hash **)(puVar2 + 0x56),allocator);
  *(lzma_index_hash **)(puVar2 + 0x56) = plVar3;
  if (plVar3 == (lzma_index_hash *)0x0) {
    return LZMA_MEM_ERROR;
  }
  *puVar2 = 0;
  *(undefined8 *)(puVar2 + 0x5e) = 0;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_stream_decoder_init(
		lzma_next_coder *next, const lzma_allocator *allocator,
		uint64_t memlimit, uint32_t flags)
{
	lzma_next_coder_init(&lzma_stream_decoder_init, next, allocator);

	if (flags & ~LZMA_SUPPORTED_FLAGS)
		return LZMA_OPTIONS_ERROR;

	lzma_stream_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &stream_decode;
		next->end = &stream_decoder_end;
		next->get_check = &stream_decoder_get_check;
		next->memconfig = &stream_decoder_memconfig;

		coder->block_decoder = LZMA_NEXT_CODER_INIT;
		coder->index_hash = NULL;
	}

	coder->memlimit = my_max(1, memlimit);
	coder->memusage = LZMA_MEMUSAGE_BASE;
	coder->tell_no_check = (flags & LZMA_TELL_NO_CHECK) != 0;
	coder->tell_unsupported_check
			= (flags & LZMA_TELL_UNSUPPORTED_CHECK) != 0;
	coder->tell_any_check = (flags & LZMA_TELL_ANY_CHECK) != 0;
	coder->ignore_check = (flags & LZMA_IGNORE_CHECK) != 0;
	coder->concatenated = (flags & LZMA_CONCATENATED) != 0;
	coder->first_stream = true;

	return stream_decoder_reset(coder, allocator);
}